

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ravi_type_map type;
  TString *usertype;
  
  pcVar3 = luaF_getlocalname(p,reg + 1,lastpc,&type,&usertype);
  *name = pcVar3;
  if (pcVar3 != (char *)0x0) {
    return "local";
  }
  iVar2 = 0;
  uVar6 = 0xffffffff;
  for (uVar5 = 0; (uint)(~(lastpc >> 0x1f) & lastpc) != uVar5; uVar5 = uVar5 + 1) {
    uVar4 = p->code[uVar5];
    uVar10 = uVar4 & 0xff;
    uVar9 = uVar4 >> 8 & 0x7f;
    if (uVar10 - 0x24 < 2) {
LAB_001160a5:
      if ((int)uVar9 <= reg) {
LAB_001160c6:
        uVar6 = uVar5 & 0xffffffff;
        if ((long)uVar5 < (long)iVar2) {
          uVar6 = 0xffffffff;
        }
      }
    }
    else {
      if (uVar10 == 0x29) {
        uVar9 = uVar9 + 2;
        goto LAB_001160a5;
      }
      if (uVar10 != 0x1e) {
        if (uVar10 == 4) {
          if (((int)uVar9 <= reg) && ((uint)reg <= uVar9 + (uVar4 >> 0x18))) goto LAB_001160c6;
          goto LAB_001160ce;
        }
        if ((uVar9 != reg) || ((luaP_opmodes[uVar4 & 0xff] & 0x40) == 0)) goto LAB_001160ce;
        goto LAB_001160c6;
      }
      iVar7 = (int)uVar5 + -0x7fff + (uVar4 >> 0x10);
      iVar8 = iVar2;
      if (iVar2 < iVar7) {
        iVar8 = iVar7;
      }
      if ((long)iVar7 <= (long)uVar5) {
        iVar8 = iVar2;
      }
      if (iVar7 <= lastpc) {
        iVar2 = iVar8;
      }
    }
LAB_001160ce:
  }
  iVar2 = (int)uVar6;
  if (iVar2 == -1) {
    return (char *)0x0;
  }
  uVar4 = p->code[iVar2];
  uVar9 = uVar4 & 0xff;
  uVar5 = (ulong)(uVar9 - 0x4b);
  if (uVar9 - 0x4b < 0x29) {
    if ((0x12900000060U >> (uVar5 & 0x3f) & 1) != 0) {
switchD_00116164_caseD_6:
      if (((char)uVar4 == '\x06') || (uVar9 == 0x73)) {
        pcVar3 = upvalname(p,uVar4 >> 0x18);
      }
      else {
        pcVar3 = luaF_getlocalname(p,(uVar4 >> 0x18) + 1,iVar2,&type,&usertype);
      }
      kname(p,iVar2,uVar4 >> 0x10 & 0xff,name);
      if (pcVar3 == (char *)0x0) {
        return "field";
      }
      iVar2 = strcmp(pcVar3,"_ENV");
      if (iVar2 == 0) {
        return "global";
      }
      return "field";
    }
    if ((0x1fUL >> (uVar5 & 0x3f) & 1) != 0) goto switchD_00116164_caseD_0;
    if ((0x4400000000U >> (uVar5 & 0x3f) & 1) != 0) goto switchD_00116164_caseD_c;
  }
  switch(uVar9) {
  case 0:
switchD_00116164_caseD_0:
    if ((uVar4 >> 8 & 0x7f) <= uVar4 >> 0x18) {
      return (char *)0x0;
    }
    pcVar3 = getobjname(p,iVar2,uVar4 >> 0x18,name);
    return pcVar3;
  case 1:
  case 2:
    if ((char)uVar4 == '\x01') {
      uVar4 = uVar4 >> 0x10;
    }
    else {
      uVar4 = p->code[(long)iVar2 + 1] >> 8;
    }
    if ((*(ushort *)((long)&p->k->tt_ + (ulong)(uVar4 << 4)) & 0xf) != 4) {
      return (char *)0x0;
    }
    lVar1 = *(long *)((long)&p->k->value_ + (ulong)(uVar4 << 4));
    if ((*(byte *)(lVar1 + 8) & 0xf) != 4) {
      __assert_fail("(((((&p->k[b])->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                    ,0x1f9,"const char *getobjname(Proto *, int, int, const char **)");
    }
    *name = (char *)(lVar1 + 0x18);
    return "constant";
  default:
    return (char *)0x0;
  case 5:
    pcVar3 = upvalname(p,uVar4 >> 0x18);
    *name = pcVar3;
    return "upvalue";
  case 6:
  case 7:
    goto switchD_00116164_caseD_6;
  case 0xc:
switchD_00116164_caseD_c:
    kname(p,iVar2,uVar4 >> 0x10 & 0xff,name);
    return "method";
  }
}

Assistant:

static const char *getobjname (Proto *p, int lastpc, int reg,
                               const char **name) {
  int pc;
  ravi_type_map type;
  TString *usertype;
  *name = luaF_getlocalname(p, reg + 1, lastpc, &type, &usertype);
  if (*name)  /* is a local? */
    return "local";
  /* else try symbolic execution */
  pc = findsetreg(p, lastpc, reg);
  if (pc != -1) {  /* could find instruction? */
    Instruction i = p->code[pc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_RAVI_MOVEI:
      case OP_RAVI_MOVEF:
      case OP_RAVI_MOVEFARRAY:
      case OP_RAVI_MOVEIARRAY:
      case OP_RAVI_MOVETAB:
      case OP_MOVE: {
        int b = GETARG_B(i);  /* move from 'b' to 'a' */
        if (b < GETARG_A(i))
          return getobjname(p, pc, b, name);  /* get name for 'b' */
        break;
      }
      case OP_RAVI_GETI:
      case OP_RAVI_TABLE_GETFIELD:
      case OP_RAVI_GETFIELD:
      case OP_RAVI_IARRAY_GET:
      case OP_RAVI_FARRAY_GET:
      case OP_GETTABUP:
      case OP_RAVI_GETTABUP_SK:
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        int t = GETARG_B(i);  /* table index */
        const char *vn = (op != OP_GETTABUP && op != OP_RAVI_GETTABUP_SK)  /* name of indexed variable */
                         ? luaF_getlocalname(p, t + 1, pc, &type, &usertype)  /* t+1 is the local variable number */
                         : upvalname(p, t);
        kname(p, pc, k, name);
        return (vn && strcmp(vn, LUA_ENV) == 0) ? "global" : "field";
      }
      case OP_GETUPVAL: {
        *name = upvalname(p, GETARG_B(i));
        return "upvalue";
      }
      case OP_LOADK:
      case OP_LOADKX: {
        int b = (op == OP_LOADK) ? GETARG_Bx(i)
                                 : GETARG_Ax(p->code[pc + 1]);
        if (ttisstring(&p->k[b])) {
          *name = svalue(&p->k[b]);
          return "constant";
        }
        break;
      }
      case OP_RAVI_SELF_SK:
      case OP_RAVI_TABLE_SELF_SK:
      case OP_SELF: {
        int k = GETARG_C(i);  /* key index */
        kname(p, pc, k, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}